

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O2

Matrix * __thiscall SpikeEstimator::getSample(Matrix *__return_storage_ptr__,SpikeEstimator *this)

{
  double dVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  Matrix local_3c8;
  Matrix local_2c8;
  Graph a;
  Physical local_c8;
  
  Graph::Graph(&a,this->spkLength);
  std::__cxx11::string::string
            ((string *)&local_408,
             (string *)
             &(this->spkA->super_StochasticVariable).super_StochasticProcess.super_Parametric.
              parametricName);
  std::operator+(&local_3e8,"O-SPIKE measure ",&local_408);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c8,
                 &local_3e8," - ");
  std::__cxx11::string::string
            ((string *)&local_428,
             (string *)
             &(this->spkB->super_StochasticVariable).super_StochasticProcess.super_Parametric.
              parametricName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c8,
                 &local_428);
  Matrix::setName(&a.super_Matrix,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  Physical::Physical(&local_c8,&((this->super_Estimator).estimatorTime)->super_Physical);
  Matrix::setPhysical(&a.super_Matrix,0,&local_c8);
  Physical::~Physical(&local_c8);
  for (uVar2 = 0; uVar2 < this->spkLength; uVar2 = uVar2 + 1) {
    dVar1 = ((this->super_Estimator).estimatorTime)->dt;
    Matrix::operator[](&local_3c8,&a.super_Matrix,(int)uVar2);
    Matrix::operator[](&local_2c8,&local_3c8,0);
    Matrix::operator=(&local_2c8,(double)(uVar2 & 0xffffffff) * dVar1);
    Matrix::~Matrix(&local_2c8);
    Matrix::~Matrix(&local_3c8);
    dVar1 = this->spkSample[uVar2];
    Matrix::operator[](&local_3c8,&a.super_Matrix,(int)uVar2);
    Matrix::operator[](&local_2c8,&local_3c8,1);
    Matrix::operator=(&local_2c8,dVar1);
    Matrix::~Matrix(&local_2c8);
    Matrix::~Matrix(&local_3c8);
  }
  Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
  Matrix::~Matrix(&a.super_Matrix);
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getSample()
{
    Graph a{int(spkLength)};
    a.setName("O-SPIKE measure " + spkA->getName() + " - " + spkB->getName());
    a.setPhysical(0, *estimatorTime );

    for(uint i=0; i<spkLength; i++) {
        a[int(i)][0] = double(i) * estimatorTime->dt;
        a[int(i)][1] = spkSample[i];
    }

    return a;
}